

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pool.cpp
# Opt level: O1

void __thiscall AGSSock::Pool::clear(Pool *this)

{
  __sighandler_t __handler;
  int in_ESI;
  
  pthread_mutex_lock((pthread_mutex_t *)&this->guard_);
  std::
  _Hashtable<AGSSock::Socket_*,_AGSSock::Socket_*,_std::allocator<AGSSock::Socket_*>,_std::__detail::_Identity,_std::equal_to<AGSSock::Socket_*>,_std::hash<AGSSock::Socket_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::clear((_Hashtable<AGSSock::Socket_*,_AGSSock::Socket_*,_std::allocator<AGSSock::Socket_*>,_std::__detail::_Identity,_std::equal_to<AGSSock::Socket_*>,_std::hash<AGSSock::Socket_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
           *)this);
  AGSSockAPI::Beacon::signal(&this->beacon_,in_ESI,__handler);
  pthread_mutex_unlock((pthread_mutex_t *)&this->guard_);
  return;
}

Assistant:

void Pool::clear()
{
	Mutex::Lock lock(guard_);

	sockets_.clear();
	beacon_.signal();
}